

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

void Abc_NtkComputeFanoutInfo(Abc_Obj_t *pObj,float Slew)

{
  Abc_Obj_t *pObj_00;
  int iVar1;
  SC_Cell *p;
  int i;
  long lVar2;
  float fVar3;
  
  lVar2 = 0;
  do {
    if ((pObj->vFanouts).nSize <= lVar2) {
      return;
    }
    pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar2]];
    iVar1 = Abc_ObjIsBarBuf(pObj_00);
    if (iVar1 == 0) {
      if ((*(uint *)&pObj_00->field_0x14 & 0xf) - 5 < 0xfffffffe) {
        iVar1 = Abc_NodeFindFanin(pObj_00,pObj);
        fVar3 = Abc_NtkComputeEdgeDept(pObj_00,iVar1,Slew);
        Bus_SclObjSetETime(pObj_00,fVar3);
        p = Abc_SclObjCell(pObj_00);
        fVar3 = SC_CellPinCap(p,iVar1);
        goto LAB_003609cb;
      }
    }
    else {
      fVar3 = Bus_SclObjDept(pObj_00);
      Bus_SclObjSetETime(pObj_00,fVar3);
      fVar3 = Bus_SclObjLoad(pObj_00);
LAB_003609cb:
      Bus_SclObjSetCin(pObj_00,fVar3);
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void Abc_NtkComputeFanoutInfo( Abc_Obj_t * pObj, float Slew )
{
    Abc_Obj_t * pFanout;
    int i;
    Abc_ObjForEachFanout( pObj, pFanout, i )
    {
        if ( Abc_ObjIsBarBuf(pFanout) )
        {
            Bus_SclObjSetETime( pFanout, Bus_SclObjDept(pFanout) );
            Bus_SclObjSetCin( pFanout, Bus_SclObjLoad(pFanout) );
        }
        else if ( !Abc_ObjIsCo(pFanout) )
        {
            int iFanin = Abc_NodeFindFanin(pFanout, pObj);
            Bus_SclObjSetETime( pFanout, Abc_NtkComputeEdgeDept(pFanout, iFanin, Slew) );
            Bus_SclObjSetCin( pFanout, SC_CellPinCap( Abc_SclObjCell(pFanout), iFanin ) );
        }
    }
}